

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O2

int tinfl_decompress_mem_to_callback
              (void *pIn_buf,size_t *pIn_buf_size,tinfl_put_buf_func_ptr pPut_buf_func,
              void *pPut_buf_user,int flags)

{
  mz_uint8 *pOut_buf_next;
  tinfl_status tVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined1 local_2b68 [8];
  tinfl_decompressor decomp;
  size_t local_58;
  size_t in_buf_size;
  size_t dst_buf_size;
  mz_uint8 *local_40;
  mz_uint32 local_34;
  
  decomp._10992_8_ = pIn_buf;
  dst_buf_size = (size_t)pIn_buf_size;
  local_40 = (mz_uint8 *)malloc(0x8000);
  if (local_40 == (mz_uint8 *)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    local_2b68._0_4_ = 0;
    local_34 = flags & 0xfffffff9;
    lVar6 = 0;
    uVar5 = 0;
    while( true ) {
      local_58 = *(long *)dst_buf_size - lVar6;
      in_buf_size = 0x8000 - uVar5;
      pOut_buf_next = local_40 + uVar5;
      tVar1 = tinfl_decompress((tinfl_decompressor *)local_2b68,
                               (mz_uint8 *)(decomp._10992_8_ + lVar6),&local_58,local_40,
                               pOut_buf_next,&in_buf_size,local_34);
      lVar6 = lVar6 + local_58;
      iVar4 = (int)in_buf_size;
      if (in_buf_size != 0) {
        iVar2 = (*pPut_buf_func)(pOut_buf_next,iVar4,pPut_buf_user);
        if (iVar2 == 0) {
          uVar3 = 0;
          goto LAB_0016fb05;
        }
      }
      if (tVar1 != TINFL_STATUS_HAS_MORE_OUTPUT) break;
      uVar5 = (ulong)(iVar4 + (int)uVar5 & 0x7fff);
    }
    uVar3 = (uint)(tVar1 == TINFL_STATUS_DONE);
LAB_0016fb05:
    free(local_40);
    *(long *)dst_buf_size = lVar6;
  }
  return uVar3;
}

Assistant:

int tinfl_decompress_mem_to_callback(const void *pIn_buf, size_t *pIn_buf_size,
    tinfl_put_buf_func_ptr pPut_buf_func, void *pPut_buf_user,
    int flags)
{
    int result = 0;
    tinfl_decompressor decomp;
    mz_uint8 *pDict = (mz_uint8*)MZ_MALLOC(TINFL_LZ_DICT_SIZE);
    size_t in_buf_ofs = 0, dict_ofs = 0;
    if (!pDict)
        return TINFL_STATUS_FAILED;
    tinfl_init(&decomp);
    for (;;)
    {
        size_t in_buf_size = *pIn_buf_size - in_buf_ofs,
               dst_buf_size = TINFL_LZ_DICT_SIZE - dict_ofs;
        tinfl_status status = tinfl_decompress(
                &decomp, (const mz_uint8*)pIn_buf + in_buf_ofs, &in_buf_size, pDict, pDict + dict_ofs,
                &dst_buf_size,
                (flags & ~(TINFL_FLAG_HAS_MORE_INPUT | TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)));
        in_buf_ofs += in_buf_size;
        if ((dst_buf_size) &&
            (!(*pPut_buf_func)(pDict + dict_ofs, (int)dst_buf_size, pPut_buf_user)))
            break;
        if (status != TINFL_STATUS_HAS_MORE_OUTPUT)
        {
            result = (status == TINFL_STATUS_DONE);
            break;
        }
        dict_ofs = (dict_ofs + dst_buf_size) & (TINFL_LZ_DICT_SIZE - 1);
    }
    MZ_FREE(pDict);
    *pIn_buf_size = in_buf_ofs;
    return result;
}